

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O2

Label * labelling::getNextLabel
                  (Label *__return_storage_ptr__,
                  vector<labelling::Label,_std::allocator<labelling::Label>_> *labels_ptr,
                  Directions *direction)

{
  if (*direction == FWD) {
    std::
    pop_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,std::greater<void>>
              ();
  }
  else {
    std::
    pop_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>>
              ((labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)
               ._M_impl.super__Vector_impl_data._M_start,
               (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  Label::Label(__return_storage_ptr__,
               (labels_ptr->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)
               ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::pop_back(labels_ptr);
  return __return_storage_ptr__;
}

Assistant:

Label getNextLabel(
    std::vector<Label>*              labels_ptr,
    const bidirectional::Directions& direction) {
  if (direction == bidirectional::FWD)
    std::pop_heap(labels_ptr->begin(), labels_ptr->end(), std::greater<>{});
  else
    std::pop_heap(labels_ptr->begin(), labels_ptr->end());

  // Get next label as the back of the heap
  Label next_label = labels_ptr->back();
  labels_ptr->pop_back();
  return next_label;
}